

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

int spki_table_add_entry(spki_table *spki_table,spki_record *spki_record)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  tommy_list ptVar2;
  spki_update_fp p_Var3;
  undefined8 uVar4;
  tommy_uint32_t hash;
  undefined8 *puVar5;
  void *pvVar6;
  tommy_node_struct *ptVar7;
  long lVar8;
  tommy_list *pptVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  long in_FS_OFFSET;
  byte bVar13;
  spki_record in_stack_ffffffffffffff48;
  
  bVar13 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (undefined8 *)lrtr_malloc(0xc0);
  if (puVar5 == (undefined8 *)0x0) {
    iVar10 = -1;
  }
  else {
    *(uint32_t *)((long)puVar5 + 0x14) = spki_record->asn;
    puVar5[0xf] = spki_record->socket;
    uVar4 = *(undefined8 *)(spki_record->ski + 8);
    *puVar5 = *(undefined8 *)spki_record->ski;
    puVar5[1] = uVar4;
    *(undefined4 *)(puVar5 + 2) = *(undefined4 *)(spki_record->ski + 0x10);
    puVar11 = spki_record->spki;
    puVar12 = (uint8_t *)(puVar5 + 3);
    for (lVar8 = 0x5b; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar12 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
    }
    hash = tommy_inthash_u32(spki_record->asn);
    __rwlock = &spki_table->lock;
    pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    pvVar6 = tommy_hashlin_search(&spki_table->hashtable,spki_table->cmp_fp,puVar5,hash);
    if (pvVar6 == (void *)0x0) {
      tommy_hashlin_insert(&spki_table->hashtable,(tommy_hashlin_node *)(puVar5 + 0x10),puVar5,hash)
      ;
      ptVar7 = (tommy_node_struct *)(puVar5 + 0x14);
      ptVar2 = spki_table->list;
      if (ptVar2 == (tommy_list)0x0) {
        pptVar9 = &spki_table->list;
        puVar5[0x15] = ptVar7;
      }
      else {
        puVar5[0x15] = ptVar2->prev;
        ptVar2->prev = ptVar7;
        pptVar9 = (tommy_list *)puVar5[0x15];
      }
      puVar5[0x14] = 0;
      *pptVar9 = ptVar7;
      puVar5[0x16] = puVar5;
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      p_Var3 = spki_table->update_fp;
      iVar10 = 0;
      if (p_Var3 != (spki_update_fp)0x0) {
        puVar5 = (undefined8 *)&stack0xffffffffffffff48;
        for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar5 = *(undefined8 *)spki_record->ski;
          spki_record = (spki_record *)((long)spki_record + (ulong)bVar13 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar13 * -2 + 1;
        }
        (*p_Var3)(spki_table,in_stack_ffffffffffffff48,true);
      }
    }
    else {
      lrtr_free(puVar5);
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      iVar10 = -2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

int spki_table_add_entry(struct spki_table *spki_table, struct spki_record *spki_record)
{
	uint32_t hash;
	struct key_entry *entry;

	entry = lrtr_malloc(sizeof(*entry));
	if (!entry)
		return SPKI_ERROR;

	spki_record_to_key_entry(spki_record, entry);
	hash = tommy_inthash_u32(spki_record->asn);

	pthread_rwlock_wrlock(&spki_table->lock);
	if (tommy_hashlin_search(&spki_table->hashtable, spki_table->cmp_fp, entry, hash)) {
		lrtr_free(entry);
		pthread_rwlock_unlock(&spki_table->lock);
		return SPKI_DUPLICATE_RECORD;
	}

	/* Insert into hashtable and list */
	tommy_hashlin_insert(&spki_table->hashtable, &entry->hash_node, entry, hash);
	tommy_list_insert_tail(&spki_table->list, &entry->list_node, entry);
	pthread_rwlock_unlock(&spki_table->lock);
	spki_table_notify_clients(spki_table, spki_record, true);
	return SPKI_SUCCESS;
}